

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean_test.cpp
# Opt level: O0

void __thiscall
Boolean_PropertiesNoIntersection_Test::TestBody(Boolean_PropertiesNoIntersection_Test *this)

{
  initializer_list<manifold::MeshGLP<float,_unsigned_int>_> __l;
  bool bVar1;
  char *message;
  MeshGLP<float,_unsigned_int> *local_2d8;
  allocator<manifold::MeshGLP<float,_unsigned_int>_> local_2a1;
  MeshGLP<float,_unsigned_int> *local_2a0;
  MeshGLP<float,_unsigned_int> local_298;
  iterator local_1b0;
  pointer local_1a8;
  vector<manifold::MeshGLP<float,_unsigned_int>,_std::allocator<manifold::MeshGLP<float,_unsigned_int>_>_>
  local_1a0;
  AssertHelper local_188;
  Message local_180;
  int local_174;
  pointer local_170;
  undefined1 local_168 [8];
  AssertionResult gtest_ar;
  Manifold result;
  pointer local_148;
  vec<double,_3> local_140;
  Manifold local_128 [8];
  Manifold m1;
  Manifold local_108 [8];
  Manifold m0;
  undefined1 local_f8 [8];
  MeshGL cubeUV;
  Boolean_PropertiesNoIntersection_Test *this_local;
  
  cubeUV._224_8_ = this;
  CubeUV();
  manifold::Manifold::Manifold(local_108,(MeshGLP *)local_f8);
  local_148 = (pointer)0x3ff8000000000000;
  linalg::vec<double,_3>::vec(&local_140,(double *)&local_148);
  manifold::Manifold::Translate(local_128,local_108);
  manifold::Manifold::operator+((Manifold *)&gtest_ar.message_,local_108);
  local_170 = (pointer)manifold::Manifold::NumProp();
  local_174 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_168,"result.NumProp()","2",(unsigned_long *)&local_170,&local_174);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_180);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/boolean_test.cpp"
               ,0xa2,message);
    testing::internal::AssertHelper::operator=(&local_188,&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  local_2a0 = &local_298;
  manifold::MeshGLP<float,_unsigned_int>::MeshGLP
            (local_2a0,(MeshGLP<float,_unsigned_int> *)local_f8);
  local_1b0 = &local_298;
  local_1a8 = (pointer)0x1;
  std::allocator<manifold::MeshGLP<float,_unsigned_int>_>::allocator(&local_2a1);
  __l._M_len = (size_type)local_1a8;
  __l._M_array = local_1b0;
  std::
  vector<manifold::MeshGLP<float,_unsigned_int>,_std::allocator<manifold::MeshGLP<float,_unsigned_int>_>_>
  ::vector(&local_1a0,__l,&local_2a1);
  RelatedGL((Manifold *)&gtest_ar.message_,&local_1a0,false,false);
  std::
  vector<manifold::MeshGLP<float,_unsigned_int>,_std::allocator<manifold::MeshGLP<float,_unsigned_int>_>_>
  ::~vector(&local_1a0);
  std::allocator<manifold::MeshGLP<float,_unsigned_int>_>::~allocator(&local_2a1);
  local_2d8 = (MeshGLP<float,_unsigned_int> *)&local_1b0;
  do {
    local_2d8 = local_2d8 + -1;
    manifold::MeshGLP<float,_unsigned_int>::~MeshGLP(local_2d8);
  } while (local_2d8 != &local_298);
  manifold::Manifold::~Manifold((Manifold *)&gtest_ar.message_);
  manifold::Manifold::~Manifold(local_128);
  manifold::Manifold::~Manifold(local_108);
  manifold::MeshGLP<float,_unsigned_int>::~MeshGLP((MeshGLP<float,_unsigned_int> *)local_f8);
  return;
}

Assistant:

TEST(Boolean, PropertiesNoIntersection) {
  MeshGL cubeUV = CubeUV();
  Manifold m0(cubeUV);
  Manifold m1 = m0.Translate(vec3(1.5));
  Manifold result = m0 + m1;
  EXPECT_EQ(result.NumProp(), 2);
  RelatedGL(result, {cubeUV});
}